

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void CollectMergedSet(VmInstruction *inst,uint marker,SmallArray<VmInstruction_*,_32U> *mergedSet)

{
  VmValue *pVVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstructionType VVar4;
  VmValueType VVar5;
  ulong uVar6;
  VmInstruction *pVVar7;
  VmInstruction *pVVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (inst->marker != 0) {
    return;
  }
  if (mergedSet->count == mergedSet->max) {
    SmallArray<VmInstruction_*,_32U>::grow(mergedSet,mergedSet->count);
  }
  if (mergedSet->data == (VmInstruction **)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<VmInstruction *, 32>::push_back(const T &) [T = VmInstruction *, N = 32]"
                 );
  }
  uVar11 = mergedSet->count;
  mergedSet->count = uVar11 + 1;
  mergedSet->data[uVar11] = inst;
  inst->marker = marker;
  VVar4 = inst->cmd;
  if (VVar4 == VM_INST_PHI) {
    if ((inst->arguments).count != 0) {
      uVar12 = 0;
      do {
        pVVar7 = (VmInstruction *)(inst->arguments).data[uVar12];
        if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
          pVVar7 = (VmInstruction *)0x0;
        }
        CollectMergedSet(pVVar7,marker,mergedSet);
        uVar11 = (int)uVar12 + 2;
        uVar12 = (ulong)uVar11;
      } while (uVar11 < (inst->arguments).count);
      VVar4 = inst->cmd;
      goto LAB_001a3582;
    }
  }
  else {
LAB_001a3582:
    if (VVar4 == VM_INST_MOV) {
      if ((inst->arguments).count == 0) {
LAB_001a37a7:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      pVVar7 = (VmInstruction *)*(inst->arguments).data;
      if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
        pVVar7 = (VmInstruction *)0x0;
      }
      CollectMergedSet(pVVar7,marker,mergedSet);
      VVar4 = inst->cmd;
    }
    if (VVar4 == VM_INST_DEF) {
      uVar11 = (inst->super_VmValue).users.count;
      if (uVar11 == 0) {
        return;
      }
      uVar12 = 0;
      do {
        pVVar1 = (inst->super_VmValue).users.data[uVar12];
        if ((((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
            (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) &&
           (VVar5 = pVVar1[1].type.type, VVar5 != VM_TYPE_VOID)) {
          uVar9 = 1;
          do {
            pVVar7 = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + -8 + uVar9 * 8);
            if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
              pVVar7 = (VmInstruction *)0x0;
            }
            uVar6 = (ulong)VVar5;
            if (uVar6 <= uVar9) goto LAB_001a37a7;
            pVVar8 = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + uVar9 * 8);
            if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
              if (pVVar7 != (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1c47,
                              "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                             );
              }
LAB_001a37ea:
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c46,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
            if (pVVar7 == (VmInstruction *)0x0) goto LAB_001a37ea;
            if (pVVar7 == inst) {
              CollectMergedSet(pVVar8,marker,mergedSet);
              VVar5 = pVVar1[1].type.type;
              uVar6 = (ulong)VVar5;
            }
            uVar10 = uVar9 + 1;
            uVar9 = uVar9 + 2;
          } while (uVar10 < uVar6);
          uVar11 = (inst->super_VmValue).users.count;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar11);
      goto LAB_001a3698;
    }
  }
  uVar11 = (inst->super_VmValue).users.count;
LAB_001a3698:
  if (uVar11 != 0) {
    uVar12 = 0;
    do {
      pVVar7 = (VmInstruction *)(inst->super_VmValue).users.data[uVar12];
      if ((pVVar7 == (VmInstruction *)0x0) || ((pVVar7->super_VmValue).typeID != 2)) {
        pVVar7 = (VmInstruction *)0x0;
      }
      VVar4 = pVVar7->cmd;
      if (VVar4 == VM_INST_PHI) {
        CollectMergedSet(pVVar7,marker,mergedSet);
        VVar4 = pVVar7->cmd;
      }
      if (VVar4 == VM_INST_MOV) {
        CollectMergedSet(pVVar7,marker,mergedSet);
        VVar4 = pVVar7->cmd;
      }
      if ((VVar4 == VM_INST_PARALLEL_COPY) && (uVar11 = (pVVar7->arguments).count, uVar11 != 0)) {
        uVar9 = 1;
        do {
          ppVVar2 = (pVVar7->arguments).data;
          pVVar8 = (VmInstruction *)ppVVar2[uVar9 - 1];
          if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
            pVVar8 = (VmInstruction *)0x0;
          }
          uVar6 = (ulong)uVar11;
          if (uVar6 <= uVar9) goto LAB_001a37a7;
          pVVar3 = (VmInstruction *)ppVVar2[uVar9];
          if ((pVVar3 == (VmInstruction *)0x0) || ((pVVar3->super_VmValue).typeID != 2)) {
            if (pVVar8 != (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c62,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
LAB_001a3788:
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1c61,
                          "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                         );
          }
          if (pVVar8 == (VmInstruction *)0x0) goto LAB_001a3788;
          if (pVVar3 == inst) {
            CollectMergedSet(pVVar8,marker,mergedSet);
            uVar11 = (pVVar7->arguments).count;
            uVar6 = (ulong)uVar11;
          }
          uVar10 = uVar9 + 1;
          uVar9 = uVar9 + 2;
        } while (uVar10 < uVar6);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (inst->super_VmValue).users.count);
  }
  return;
}

Assistant:

void CollectMergedSet(VmInstruction *inst, unsigned marker, SmallArray<VmInstruction*, 32> &mergedSet)
{
	if(inst->marker != 0)
		return;

	mergedSet.push_back(inst);

	inst->marker = marker;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			CollectMergedSet(instruction, marker, mergedSet);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		CollectMergedSet(instruction, marker, mergedSet);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						CollectMergedSet(source, marker, mergedSet);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_MOV)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					CollectMergedSet(destination, marker, mergedSet);
			}
		}
	}
}